

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void transaction_tests::CheckWithFlag
               (CTransactionRef *output,CMutableTransaction *input,uint32_t flags,bool success)

{
  pointer pCVar1;
  bool bVar2;
  long in_FS_OFFSET;
  ScriptError error;
  CTransaction inputi;
  BaseSignatureChecker local_d8;
  CTransaction *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  ScriptError local_ac;
  CTransaction local_a8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&local_a8,input);
  pCVar1 = (((output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
           ._M_start;
  local_d8._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_0114ca30;
  local_c8 = 0;
  local_c0 = pCVar1->nValue;
  local_b8 = 0;
  local_d0 = &local_a8;
  bVar2 = VerifyScript(&(local_a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->scriptSig,&pCVar1->scriptPubKey,
                       &(local_a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->scriptWitness,flags,&local_d8,&local_ac)
  ;
  if (bVar2 != success) {
    __assert_fail("ret == success",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1ef,
                  "void transaction_tests::CheckWithFlag(const CTransactionRef &, const CMutableTransaction &, uint32_t, bool)"
                 );
  }
  CTransaction::~CTransaction(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckWithFlag(const CTransactionRef& output, const CMutableTransaction& input, uint32_t flags, bool success)
{
    ScriptError error;
    CTransaction inputi(input);
    bool ret = VerifyScript(inputi.vin[0].scriptSig, output->vout[0].scriptPubKey, &inputi.vin[0].scriptWitness, flags, TransactionSignatureChecker(&inputi, 0, output->vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &error);
    assert(ret == success);
}